

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  FArrayBox *pFVar1;
  FArrayBox *__args_4;
  pointer pSVar2;
  Geometry *pGVar3;
  Box *pBVar4;
  AmrLevel *pAVar5;
  Real *pRVar6;
  undefined8 uVar7;
  bool bVar8;
  int extraout_EAX;
  int iVar9;
  int iVar10;
  int extraout_EAX_00;
  DeriveRec *pDVar11;
  DeriveBoxMap p_Var12;
  int *piVar13;
  long lVar14;
  pointer *ppbVar15;
  pointer *ppbVar16;
  DeriveFunc p_Var17;
  DeriveFunc3D p_Var18;
  int *piVar19;
  int iVar20;
  FabArrayBase *pFVar21;
  int dc;
  int dcomp;
  int k;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  int scomp;
  int ncomp;
  Geometry *local_300;
  FabArrayBase *local_2f8;
  Box *local_2f0;
  AmrLevel *local_2e8;
  int n_state;
  int n_der;
  int idx;
  DeriveRec *local_2d0;
  int *local_2c8;
  Real *local_2c0;
  Box *local_2b8;
  IntVect *local_2b0;
  double *local_2a8;
  double *local_2a0;
  int *local_298;
  ulong local_290;
  Real dt;
  Real time_local;
  Box bx1;
  pointer pbStack_258;
  int local_250;
  Vector<int,_std::allocator<int>_> *local_240;
  Vector<int,_std::allocator<int>_> *local_238;
  Box local_214;
  RealBox *local_1f8;
  DeriveFunc local_1f0;
  int *local_1e8;
  RealBox local_1e0;
  MultiFab srcMF;
  
  local_2f0 = (Box *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  iVar20 = *(int *)(key + 0xc0);
  bVar8 = isStateVariable((string *)ctx,&index,&scomp);
  if (bVar8) {
    FillPatch(this,(MultiFab *)key,iVar20,(Real)local_2f0,index,scomp,1,(int)keylen);
    iVar20 = extraout_EAX;
  }
  else {
    local_2f8 = (FabArrayBase *)key;
    local_2e8 = this;
    pDVar11 = DeriveList::get((DeriveList *)derive_lst,(string *)ctx);
    if (pDVar11 == (DeriveRec *)0x0) {
      std::__cxx11::string::string
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ",
                 (allocator *)&bx1);
      std::__cxx11::string::append((string *)&srcMF);
      Error_host((char *)CONCAT44(srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                  _vptr_FabArrayBase._4_4_,
                                  (int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                       _vptr_FabArrayBase));
      iVar20 = std::__cxx11::string::~string((string *)&srcMF);
    }
    else {
      dcomp = 0;
      local_290 = (ulong)keylen & 0xffffffff;
      DeriveRec::getRange(pDVar11,0,&index,&scomp,&ncomp);
      pAVar5 = local_2e8;
      local_300 = (Geometry *)
                  &(local_2e8->state).
                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start[index].grids;
      BoxArray::operator[]((Box *)&srcMF,(BoxArray *)local_300,0);
      p_Var12 = DeriveRec::boxMap(pDVar11);
      (*p_Var12)(&bx1,(Box *)&srcMF);
      iVar20 = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
               bx1.smallend.vect[0]) + iVar20;
      local_2d0 = pDVar11;
      iVar9 = DeriveRec::numState(pDVar11);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffda0 = (pointer)0x0;
      pbStack_258 = (pointer)0x0;
      MultiFab::MultiFab(&srcMF,(BoxArray *)local_300,&pAVar5->dmap,iVar9,iVar20,(MFInfo *)&bx1,
                         (pAVar5->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      pDVar11 = local_2d0;
      for (iVar9 = 0; iVar10 = DeriveRec::numRange(pDVar11), iVar9 < iVar10; iVar9 = iVar9 + 1) {
        DeriveRec::getRange(pDVar11,iVar9,&index,&scomp,&ncomp);
        FillPatch(local_2e8,&srcMF,iVar20,(Real)local_2f0,index,scomp,ncomp,dcomp);
        dcomp = dcomp + ncomp;
      }
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,pDVar11);
      uVar7 = bx1.bigend.vect._4_8_;
      std::_Function_base::~_Function_base((_Function_base *)&bx1);
      pFVar21 = local_2f8;
      if (uVar7 == 0) {
        MFIter::MFIter((MFIter *)&bx1,local_2f8,true);
        local_2c0 = (local_2e8->geom).super_CoordSys.dx;
        local_1f8 = &(local_2e8->geom).prob_domain;
        local_2c8 = &local_2e8->level;
        while( true ) {
          ppbVar16 = &pbStack_258;
          lVar14 = (long)(int)pbStack_258;
          if (local_250 <= (int)pbStack_258) break;
          idx = (local_240->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar14];
          if (local_238 != (Vector<int,_std::allocator<int>_> *)0x0) {
            lVar14 = (long)(local_238->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14];
          }
          local_2a0 = BaseFab<double>::dataPtr
                                (*(BaseFab<double> **)
                                  (*(long *)((long)&pFVar21[1].boxarray.m_bat.m_op + 0xc) +
                                  lVar14 * 8),(int)local_290);
          ppbVar15 = ppbVar16;
          if (local_238 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar15 = (pointer *)
                       ((local_238->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_258);
          }
          lVar14 = *(long *)(*(long *)((long)&pFVar21[1].boxarray.m_bat.m_op + 0xc) +
                            (long)*(int *)ppbVar15 * 8);
          MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
          n_der = DeriveRec::numDerive(pDVar11);
          ppbVar15 = ppbVar16;
          if (local_238 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar15 = (pointer *)
                       ((local_238->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_258);
          }
          local_2a8 = BaseFab<double>::dataPtr
                                (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15]->
                                  super_BaseFab<double>,0);
          pDVar11 = local_2d0;
          if (local_238 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar16 = (pointer *)
                       ((local_238->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_258);
          }
          local_298 = (int *)(lVar14 + 0x24);
          pFVar1 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar16];
          local_2f0 = &(pFVar1->super_BaseFab<double>).domain;
          local_2b0 = &(pFVar1->super_BaseFab<double>).domain.bigend;
          n_state = DeriveRec::numState(local_2d0);
          pAVar5 = local_2e8;
          pSVar2 = (local_2e8->state).
                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_2b8 = &pSVar2[index].domain;
          local_300 = (Geometry *)&pSVar2[index].domain.bigend;
          local_1e8 = DeriveRec::getBC(pDVar11);
          pRVar6 = local_2c0;
          RealBox::RealBox(&local_1e0,&local_214,local_2c0,local_1f8->xlo);
          dt = (pAVar5->parent->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[pAVar5->level];
          p_Var17 = DeriveRec::derFunc(pDVar11);
          piVar13 = local_298;
          pBVar4 = local_2f0;
          pGVar3 = local_300;
          if (p_Var17 == (DeriveFunc)0x0) {
            p_Var18 = DeriveRec::derFunc3D(pDVar11);
            if (p_Var18 == (DeriveFunc3D)0x0) {
              Error_host("AmrLevel::derive: no function available");
            }
            else {
              piVar19 = DeriveRec::getBC3D(pDVar11);
              p_Var18 = DeriveRec::derFunc3D(pDVar11);
              (*p_Var18)(local_2a0,(int *)(lVar14 + 0x18),piVar13,&n_der,local_2a8,(int *)pBVar4,
                         local_2b0->vect,&n_state,(int *)&local_214,local_214.bigend.vect,
                         (int *)local_2b8,(int *)pGVar3,local_2c0,local_1e0.xlo,&time_local,&dt,
                         piVar19,local_2c8,&idx);
            }
          }
          else {
            local_1f0 = DeriveRec::derFunc(pDVar11);
            (*local_1f0)(local_2a0,(int *)(lVar14 + 0x18),(int *)(lVar14 + 0x1c),
                         (int *)(lVar14 + 0x20),local_298,(int *)(lVar14 + 0x28),
                         (int *)(lVar14 + 0x2c),&n_der,local_2a8,(int *)local_2f0,
                         (pFVar1->super_BaseFab<double>).domain.smallend.vect + 1,
                         (pFVar1->super_BaseFab<double>).domain.smallend.vect + 2,local_2b0->vect,
                         (pFVar1->super_BaseFab<double>).domain.bigend.vect + 1,
                         (pFVar1->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                         (int *)&local_214,local_214.bigend.vect,(int *)local_2b8,(int *)local_300,
                         pRVar6,local_1e0.xlo,&time_local,&dt,local_1e8,local_2c8,&idx);
          }
          pFVar21 = local_2f8;
          MFIter::operator++((MFIter *)&bx1);
        }
      }
      else {
        MFIter::MFIter((MFIter *)&bx1,local_2f8,true);
        local_300 = &local_2e8->geom;
        while( true ) {
          if (local_250 <= (int)pbStack_258) break;
          MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
          pDVar11 = local_2d0;
          ppbVar16 = &pbStack_258;
          if (local_238 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar16 = (pointer *)
                       ((local_238->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_258);
          }
          pFVar1 = *(FArrayBox **)
                    (*(long *)((long)&pFVar21[1].boxarray.m_bat.m_op + 0xc) +
                    (long)*(int *)ppbVar16 * 8);
          __args_4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar16];
          iVar20 = DeriveRec::numDerive(local_2d0);
          DeriveRec::derFuncFab((DeriveFuncFab *)&local_1e0,pDVar11);
          piVar13 = DeriveRec::getBC(pDVar11);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                        *)&local_1e0,&local_214,pFVar1,(int)local_290,iVar20,__args_4,local_300,
                       (double)local_2f0,piVar13,local_2e8->level);
          std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
          MFIter::operator++((MFIter *)&bx1);
          pFVar21 = local_2f8;
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      iVar20 = extraout_EAX_00;
    }
  }
  return iVar20;
}

Assistant:

void
AmrLevel::derive (const std::string& name, Real time, MultiFab& mf, int dcomp)
{
    BL_ASSERT(dcomp < mf.nComp());

    const int ngrow = mf.nGrow();

    int index, scomp, ncomp;

    if (isStateVariable(name,index,scomp))
    {
        FillPatch(*this,mf,ngrow,time,index,scomp,1,dcomp);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0,index,scomp,ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA,dmap,rec->numState(),ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k,index,scomp,ncomp);

            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox();
                FArrayBox& derfab = mf[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                const int dncomp = rec->numDerive();
                rec->derFuncFab()(bx, derfab, dcomp, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
        {
            int         idx     = mfi.index();
            Real*       ddat    = mf[mfi].dataPtr(dcomp);
            const int*  dlo     = mf[mfi].loVect();
            const int*  dhi     = mf[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox& temp = RealBox(gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&idx);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&idx);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }
}